

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O0

GENERAL_NAME *
a2i_GENERAL_NAME(GENERAL_NAME *out,X509V3_EXT_METHOD *method,X509V3_CTX *ctx,int gen_type,
                char *value,int is_nc)

{
  int iVar1;
  ASN1_IA5STRING *str_00;
  size_t len_s;
  ASN1_OBJECT *pAVar2;
  ASN1_OCTET_STRING *pAVar3;
  ASN1_OBJECT *obj;
  ASN1_IA5STRING *str;
  GENERAL_NAME *gen;
  int is_nc_local;
  char *value_local;
  int gen_type_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  GENERAL_NAME *out_local;
  
  if (value == (char *)0x0) {
    ERR_put_error(0x14,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x19d);
    return (GENERAL_NAME *)0x0;
  }
  str = (ASN1_IA5STRING *)out;
  if ((out == (GENERAL_NAME *)0x0) &&
     (str = (ASN1_IA5STRING *)GENERAL_NAME_new(), str == (ASN1_IA5STRING *)0x0)) {
    return (GENERAL_NAME *)0x0;
  }
  switch(gen_type) {
  case 0:
    iVar1 = do_othername((GENERAL_NAME *)str,value,(X509V3_CTX *)ctx);
    if (iVar1 != 0) {
      return (GENERAL_NAME *)str;
    }
    ERR_put_error(0x14,0,0x94,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1dc);
    break;
  case 1:
  case 2:
  case 6:
    str_00 = ASN1_IA5STRING_new();
    if (str_00 != (ASN1_IA5STRING *)0x0) {
      len_s = strlen(value);
      iVar1 = ASN1_STRING_set((ASN1_STRING *)str_00,value,len_s);
      if (iVar1 != 0) {
        str->length = gen_type;
        str->data = (uchar *)str_00;
        return (GENERAL_NAME *)str;
      }
    }
    ASN1_STRING_free(str_00);
    break;
  default:
    ERR_put_error(0x14,0,0xa1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1e1);
    break;
  case 4:
    iVar1 = do_dirname((GENERAL_NAME *)str,value,(X509V3_CTX *)ctx);
    if (iVar1 != 0) {
      return (GENERAL_NAME *)str;
    }
    ERR_put_error(0x14,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1d5);
    break;
  case 7:
    str->length = 7;
    if (is_nc == 0) {
      pAVar3 = a2i_IPADDRESS(value);
      str->data = (uchar *)pAVar3;
    }
    else {
      pAVar3 = a2i_IPADDRESS_NC(value);
      str->data = (uchar *)pAVar3;
    }
    if (str->data != (uchar *)0x0) {
      return (GENERAL_NAME *)str;
    }
    ERR_put_error(0x14,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1cd);
    ERR_add_error_data(2,"value=",value);
    break;
  case 8:
    pAVar2 = OBJ_txt2obj(value,0);
    if (pAVar2 != (ASN1_OBJECT *)0x0) {
      str->length = 8;
      str->data = (uchar *)pAVar2;
      return (GENERAL_NAME *)str;
    }
    ERR_put_error(0x14,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                  ,0x1bc);
    ERR_add_error_data(2,"value=",value);
  }
  if (out == (GENERAL_NAME *)0x0) {
    GENERAL_NAME_free((GENERAL_NAME *)str);
  }
  return (GENERAL_NAME *)0x0;
}

Assistant:

static GENERAL_NAME *a2i_GENERAL_NAME(GENERAL_NAME *out,
                                      const X509V3_EXT_METHOD *method,
                                      const X509V3_CTX *ctx, int gen_type,
                                      const char *value, int is_nc) {
  if (!value) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
    return NULL;
  }

  GENERAL_NAME *gen = NULL;
  if (out) {
    gen = out;
  } else {
    gen = GENERAL_NAME_new();
    if (gen == NULL) {
      return NULL;
    }
  }

  switch (gen_type) {
    case GEN_URI:
    case GEN_EMAIL:
    case GEN_DNS: {
      ASN1_IA5STRING *str = ASN1_IA5STRING_new();
      if (str == NULL || !ASN1_STRING_set(str, value, strlen(value))) {
        ASN1_STRING_free(str);
        goto err;
      }
      gen->type = gen_type;
      gen->d.ia5 = str;
      break;
    }

    case GEN_RID: {
      ASN1_OBJECT *obj;
      if (!(obj = OBJ_txt2obj(value, 0))) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_BAD_OBJECT);
        ERR_add_error_data(2, "value=", value);
        goto err;
      }
      gen->type = GEN_RID;
      gen->d.rid = obj;
      break;
    }

    case GEN_IPADD:
      gen->type = GEN_IPADD;
      if (is_nc) {
        gen->d.ip = a2i_IPADDRESS_NC(value);
      } else {
        gen->d.ip = a2i_IPADDRESS(value);
      }
      if (gen->d.ip == NULL) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_BAD_IP_ADDRESS);
        ERR_add_error_data(2, "value=", value);
        goto err;
      }
      break;

    case GEN_DIRNAME:
      if (!do_dirname(gen, value, ctx)) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_DIRNAME_ERROR);
        goto err;
      }
      break;

    case GEN_OTHERNAME:
      if (!do_othername(gen, value, ctx)) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_OTHERNAME_ERROR);
        goto err;
      }
      break;
    default:
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNSUPPORTED_TYPE);
      goto err;
  }

  return gen;

err:
  if (!out) {
    GENERAL_NAME_free(gen);
  }
  return NULL;
}